

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O1

Vec_Str_t * Abc_ManReadFile(char *pFileName)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  Vec_Str_t *pVVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  size_t __size;
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    return (Vec_Str_t *)0x0;
  }
  pVVar3 = (Vec_Str_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  pcVar4 = (char *)malloc(100);
  pVVar3->pArray = pcVar4;
  iVar2 = fgetc(__stream);
  if (iVar2 != -1) {
    lVar5 = (long)pVVar3->nSize;
    uVar6 = pVVar3->nCap;
    pcVar4 = pVVar3->pArray;
    do {
      if ((uint)lVar5 == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (pcVar4 == (char *)0x0) {
            pcVar4 = (char *)malloc(0x10);
          }
          else {
            pcVar4 = (char *)realloc(pcVar4,0x10);
          }
          uVar6 = 0x10;
        }
        else {
          uVar1 = uVar6 * 2;
          if (SBORROW4(uVar6,uVar1) != 0 < (int)uVar6) {
            uVar6 = uVar1;
            if (pcVar4 == (char *)0x0) {
              pcVar4 = (char *)malloc((ulong)uVar1);
            }
            else {
              pcVar4 = (char *)realloc(pcVar4,(ulong)uVar1);
            }
          }
        }
      }
      pcVar4[lVar5] = (char)iVar2;
      lVar5 = lVar5 + 1;
      iVar2 = fgetc(__stream);
    } while (iVar2 != -1);
    pVVar3->nSize = (int)lVar5;
    pVVar3->nCap = uVar6;
    pVVar3->pArray = pcVar4;
  }
  uVar6 = pVVar3->nSize;
  uVar1 = pVVar3->nCap;
  if (uVar6 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(pVVar3->pArray,0x10);
      }
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar1 * 2;
      if ((int)__size <= (int)uVar1) goto LAB_002bd350;
      if (pVVar3->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(__size);
      }
      else {
        pcVar4 = (char *)realloc(pVVar3->pArray,__size);
      }
    }
    pVVar3->pArray = pcVar4;
    pVVar3->nCap = (int)__size;
  }
LAB_002bd350:
  pVVar3->nSize = uVar6 + 1;
  pVVar3->pArray[(int)uVar6] = '\0';
  fclose(__stream);
  return pVVar3;
}

Assistant:

Vec_Str_t * Abc_ManReadFile( char * pFileName )
{
    FILE * pFile;
    Vec_Str_t * vStr;
    int c;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    vStr = Vec_StrAlloc( 100 );
    while ( (c = fgetc(pFile)) != EOF )
        Vec_StrPush( vStr, (char)c );
    Vec_StrPush( vStr, '\0' );
    fclose( pFile );
    return vStr;
}